

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

opStatus __thiscall llvm::APFloat::subtract(APFloat *this,APFloat *RHS,roundingMode RM)

{
  opStatus oVar1;
  
  if ((this->U).semantics != (RHS->U).semantics) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only call on two APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x3b8,"opStatus llvm::APFloat::subtract(const APFloat &, roundingMode)");
  }
  if ((this->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
    oVar1 = detail::DoubleAPFloat::subtract
                      ((DoubleAPFloat *)&(this->U).IEEE,(DoubleAPFloat *)&(RHS->U).IEEE,RM);
    return oVar1;
  }
  oVar1 = detail::IEEEFloat::addOrSubtract(&(this->U).IEEE,&(RHS->U).IEEE,RM,true);
  return oVar1;
}

Assistant:

const fltSemantics &getSemantics() const { return *U.semantics; }